

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O1

void __thiscall buffer::trim_data(buffer *this)

{
  char *__dest;
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  
  uVar3 = (long)this->end_ - (long)this->begin_;
  iVar2 = (int)uVar3;
  if (0 < iVar2) {
    __dest = this->buffer_;
    uVar1 = (long)this->begin_ - (long)__dest;
    if (0 < (int)uVar1) {
      memmove(__dest,__dest + (uVar1 & 0x7fffffff),uVar3 & 0x7fffffff);
    }
  }
  this->begin_ = this->buffer_;
  this->end_ = this->buffer_ + iVar2;
  return;
}

Assistant:

void buffer::trim_data()
{
    int used = end_ - begin_;
    int bias = begin_ - buffer_;
    if (used > 0 && bias > 0)
    {
        memmove(buffer_, buffer_ + bias, used);
    }

    begin_ = buffer_;
    end_ = begin_ + used;
}